

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O2

size_t mserialize::
       StructSerializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
       ::serialized_size(ClockSync *t)

{
  size_t sVar1;
  long lVar2;
  size_t field_sizes [6];
  
  field_sizes[0] = 0;
  field_sizes[1] = 8;
  field_sizes[2] = 8;
  field_sizes[3] = 8;
  field_sizes[4] = 4;
  field_sizes[5] = (t->tzName)._M_string_length + 4;
  sVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 8) {
    sVar1 = sVar1 + *(long *)((long)field_sizes + lVar2);
  }
  return sVar1;
}

Assistant:

static std::size_t serialized_size(const T& t)
  {
    const std::size_t field_sizes[] = {0, serialized_size_member(t, Members::value)...};

    std::size_t result = 0;
    for (auto s : field_sizes) { result += s; }
    return result;
  }